

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_7::TwoLevelIterator::status(TwoLevelIterator *this)

{
  long lVar1;
  bool bVar2;
  Iterator *pIVar3;
  IteratorWrapper *in_RDI;
  long in_FS_OFFSET;
  IteratorWrapper *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  byte bVar4;
  byte bVar5;
  IteratorWrapper *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  IteratorWrapper::status(in_RDI);
  bVar2 = Status::ok((Status *)in_stack_ffffffffffffffa8);
  Status::~Status((Status *)in_stack_ffffffffffffffa8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pIVar3 = IteratorWrapper::iter(in_stack_ffffffffffffffa8);
    bVar4 = 0;
    bVar5 = bVar4;
    if (pIVar3 != (Iterator *)0x0) {
      IteratorWrapper::status(this_00);
      bVar2 = Status::ok((Status *)in_stack_ffffffffffffffa8);
      bVar4 = bVar2 ^ 0xff;
      bVar5 = bVar4;
      Status::~Status((Status *)in_stack_ffffffffffffffa8);
    }
    if ((bVar4 & 1) == 0) {
      Status::Status((Status *)in_RDI,
                     (Status *)CONCAT17(bVar5,CONCAT16(bVar4,in_stack_ffffffffffffffb0)));
    }
    else {
      IteratorWrapper::status(this_00);
    }
  }
  else {
    IteratorWrapper::status(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }